

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

void parseConverterOptions
               (char *inName,UConverterNamePieces *pPieces,UConverterLoadArgs *pArgs,UErrorCode *err
               )

{
  char cVar1;
  char *pcVar2;
  UConverterNamePieces *pUVar3;
  int iVar4;
  uint uVar5;
  char *local_40;
  char *dest;
  int32_t len;
  char c;
  char *cnvName;
  UErrorCode *err_local;
  UConverterLoadArgs *pArgs_local;
  UConverterNamePieces *pPieces_local;
  char *inName_local;
  
  dest._0_4_ = 0;
  pArgs->name = inName;
  pArgs->locale = pPieces->locale;
  pArgs->options = pPieces->options;
  _len = pPieces;
  for (pPieces_local = (UConverterNamePieces *)inName; cVar1 = pPieces_local->cnvName[0],
      cVar1 != '\0' && cVar1 != ',';
      pPieces_local = (UConverterNamePieces *)(pPieces_local->cnvName + 1)) {
    dest._0_4_ = (int)dest + 1;
    if (0x3b < (int)dest) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
      pPieces->cnvName[0] = '\0';
      return;
    }
    _len->cnvName[0] = cVar1;
    _len = (UConverterNamePieces *)(_len->cnvName + 1);
  }
  _len->cnvName[0] = '\0';
  pArgs->name = pPieces->cnvName;
  pUVar3 = pPieces_local;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          pPieces_local = pUVar3;
          if (pPieces_local->cnvName[0] == '\0') {
            return;
          }
          if (pPieces_local->cnvName[0] == ',') {
            pPieces_local = (UConverterNamePieces *)(pPieces_local->cnvName + 1);
          }
          iVar4 = strncmp(pPieces_local->cnvName,"locale=",7);
          if (iVar4 != 0) break;
          pPieces_local = (UConverterNamePieces *)(pPieces_local->cnvName + 7);
          dest._0_4_ = 0;
          local_40 = pPieces->locale;
          while (cVar1 = pPieces_local->cnvName[0], cVar1 != '\0' && cVar1 != ',') {
            pPieces_local = (UConverterNamePieces *)(pPieces_local->cnvName + 1);
            dest._0_4_ = (int)dest + 1;
            if (0x9c < (int)dest) {
              *err = U_ILLEGAL_ARGUMENT_ERROR;
              pPieces->locale[0] = '\0';
              return;
            }
            *local_40 = cVar1;
            local_40 = local_40 + 1;
          }
          *local_40 = '\0';
          pUVar3 = pPieces_local;
        }
        iVar4 = strncmp(pPieces_local->cnvName,"version=",8);
        if (iVar4 != 0) break;
        cVar1 = ((UConverterNamePieces *)(pPieces_local->cnvName + 8))->cnvName[0];
        if (cVar1 == '\0') {
          uVar5 = pPieces->options & 0xfffffff0;
          pPieces->options = uVar5;
          pArgs->options = uVar5;
          return;
        }
        pUVar3 = (UConverterNamePieces *)(pPieces_local->cnvName + 8);
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar5 = pPieces->options & 0xfffffff0 | (int)cVar1 - 0x30U;
          pPieces->options = uVar5;
          pArgs->options = uVar5;
          pUVar3 = (UConverterNamePieces *)(pPieces_local->cnvName + 9);
        }
      }
      iVar4 = strncmp(pPieces_local->cnvName,"swaplfnl",8);
      if (iVar4 != 0) break;
      uVar5 = pPieces->options | 0x10;
      pPieces->options = uVar5;
      pArgs->options = uVar5;
      pUVar3 = (UConverterNamePieces *)(pPieces_local->cnvName + 8);
    }
    do {
      pcVar2 = pPieces_local->cnvName;
      cVar1 = pPieces_local->cnvName[0];
      pPieces_local = (UConverterNamePieces *)(pcVar2 + 1);
    } while (cVar1 != '\0' && cVar1 != ',');
    pUVar3 = (UConverterNamePieces *)(pcVar2 + 1);
  } while (cVar1 != '\0');
  return;
}

Assistant:

static void
parseConverterOptions(const char *inName,
                      UConverterNamePieces *pPieces,
                      UConverterLoadArgs *pArgs,
                      UErrorCode *err)
{
    char *cnvName = pPieces->cnvName;
    char c;
    int32_t len = 0;

    pArgs->name=inName;
    pArgs->locale=pPieces->locale;
    pArgs->options=pPieces->options;

    /* copy the converter name itself to cnvName */
    while((c=*inName)!=0 && c!=UCNV_OPTION_SEP_CHAR) {
        if (++len>=UCNV_MAX_CONVERTER_NAME_LENGTH) {
            *err = U_ILLEGAL_ARGUMENT_ERROR;    /* bad name */
            pPieces->cnvName[0]=0;
            return;
        }
        *cnvName++=c;
        inName++;
    }
    *cnvName=0;
    pArgs->name=pPieces->cnvName;

    /* parse options. No more name copying should occur. */
    while((c=*inName)!=0) {
        if(c==UCNV_OPTION_SEP_CHAR) {
            ++inName;
        }

        /* inName is behind an option separator */
        if(uprv_strncmp(inName, "locale=", 7)==0) {
            /* do not modify locale itself in case we have multiple locale options */
            char *dest=pPieces->locale;

            /* copy the locale option value */
            inName+=7;
            len=0;
            while((c=*inName)!=0 && c!=UCNV_OPTION_SEP_CHAR) {
                ++inName;

                if(++len>=ULOC_FULLNAME_CAPACITY) {
                    *err=U_ILLEGAL_ARGUMENT_ERROR;    /* bad name */
                    pPieces->locale[0]=0;
                    return;
                }

                *dest++=c;
            }
            *dest=0;
        } else if(uprv_strncmp(inName, "version=", 8)==0) {
            /* copy the version option value into bits 3..0 of pPieces->options */
            inName+=8;
            c=*inName;
            if(c==0) {
                pArgs->options=(pPieces->options&=~UCNV_OPTION_VERSION);
                return;
            } else if((uint8_t)(c-'0')<10) {
                pArgs->options=pPieces->options=(pPieces->options&~UCNV_OPTION_VERSION)|(uint32_t)(c-'0');
                ++inName;
            }
        } else if(uprv_strncmp(inName, "swaplfnl", 8)==0) {
            inName+=8;
            pArgs->options=(pPieces->options|=UCNV_OPTION_SWAP_LFNL);
        /* add processing for new options here with another } else if(uprv_strncmp(inName, "option-name=", XX)==0) { */
        } else {
            /* ignore any other options until we define some */
            while(((c = *inName++) != 0) && (c != UCNV_OPTION_SEP_CHAR)) {
            }
            if(c==0) {
                return;
            }
        }
    }
}